

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dfa.cc
# Opt level: O1

State * __thiscall duckdb_re2::DFA::RunStateOnByte(DFA *this,State *state,int c)

{
  undefined8 uVar1;
  undefined8 uVar2;
  Workq *q;
  uint32_t flag;
  uint32_t uVar3;
  State *pSVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  Workq *mq;
  uint flag_00;
  byte bVar8;
  bool bVar9;
  undefined1 auVar10 [16];
  bool ismatch;
  bool local_1b0 [8];
  ostringstream local_1a8 [112];
  ios_base local_138 [264];
  
  if (state < (State *)0x3) {
    if (state == (State *)0x0) {
      local_1b0[0] = false;
      std::__cxx11::ostringstream::ostringstream(local_1a8);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8,"NULL state in RunStateOnByte",0x1c);
    }
    else {
      if (state == (State *)0x2) {
        return (State *)0x2;
      }
      if (state == (State *)&DAT_00000001) {
        local_1b0[0] = false;
        std::__cxx11::ostringstream::ostringstream(local_1a8);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a8,"DeadState in RunStateOnByte",0x1b);
      }
      else {
        local_1b0[0] = false;
        std::__cxx11::ostringstream::ostringstream(local_1a8);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a8,"Unexpected special state in RunStateOnByte",0x2a);
      }
    }
    std::__cxx11::ostringstream::~ostringstream(local_1a8);
    std::ios_base::~ios_base(local_138);
    pSVar4 = (State *)0x0;
  }
  else {
    if (c == 0x100) {
      uVar7 = this->prog_->bytemap_range_;
    }
    else {
      uVar7 = (uint)this->prog_->bytemap_[c];
    }
    pSVar4 = state->next_[(int)uVar7]._M_b._M_p;
    if (pSVar4 == (State *)0x0) {
      StateToWorkq(this,state,this->q0_);
      uVar7 = state->flag_;
      uVar6 = uVar7 & 0xff;
      uVar5 = uVar6 | 2;
      if (c != 10) {
        uVar5 = uVar6;
      }
      if (c == 0x100) {
        bVar9 = false;
        uVar5 = uVar5 | 10;
      }
      else {
        bVar8 = (byte)c;
        bVar9 = (bVar8 == 0x5f || (byte)(bVar8 - 0x30) < 10) || (byte)((bVar8 & 0xdf) + 0xbf) < 0x1a
        ;
      }
      flag_00 = (uint)(c == 10);
      uVar5 = (uint)(byte)((uVar7 >> 9 & 1) == 0 ^ bVar9) * 0x10 + 0x10 | uVar5;
      if ((uVar7 >> 0x10 & ~uVar6 & uVar5) != 0) {
        RunWorkqOnEmptyString(this,this->q0_,this->q1_,uVar5);
        uVar1 = this->q0_;
        uVar2 = this->q1_;
        auVar10._8_4_ = (int)uVar1;
        auVar10._0_8_ = uVar2;
        auVar10._12_4_ = (int)((ulong)uVar1 >> 0x20);
        this->q0_ = (Workq *)uVar2;
        this->q1_ = (Workq *)auVar10._8_8_;
      }
      local_1b0[0] = false;
      RunWorkqOnByte(this,this->q0_,this->q1_,c,flag_00,local_1b0);
      mq = this->q0_;
      q = this->q1_;
      this->q0_ = q;
      this->q1_ = mq;
      if (this->kind_ != kManyMatch) {
        mq = (Workq *)0x0;
      }
      uVar3 = flag_00 | 0x100;
      if (local_1b0[0] == false) {
        mq = (Workq *)0x0;
        uVar3 = flag_00;
      }
      flag = uVar3 + 0x200;
      if (bVar9 == false) {
        flag = uVar3;
      }
      pSVar4 = WorkqToCachedState(this,q,mq,flag);
      if (c == 0x100) {
        uVar7 = this->prog_->bytemap_range_;
      }
      else {
        uVar7 = (uint)this->prog_->bytemap_[c];
      }
      state->next_[(int)uVar7]._M_b._M_p = pSVar4;
    }
  }
  return pSVar4;
}

Assistant:

DFA::State* DFA::RunStateOnByte(State* state, int c) {
  //mutex_.AssertHeld();

  if (state <= SpecialStateMax) {
    if (state == FullMatchState) {
      // It is convenient for routines like PossibleMatchRange
      // if we implement RunStateOnByte for FullMatchState:
      // once you get into this state you never get out,
      // so it's pretty easy.
      return FullMatchState;
    }
    if (state == DeadState) {
      LOG(DFATAL) << "DeadState in RunStateOnByte";
      return NULL;
    }
    if (state == NULL) {
      LOG(DFATAL) << "NULL state in RunStateOnByte";
      return NULL;
    }
    LOG(DFATAL) << "Unexpected special state in RunStateOnByte";
    return NULL;
  }

  // If someone else already computed this, return it.
  State* ns = state->next_[ByteMap(c)].load(std::memory_order_relaxed);
  if (ns != NULL)
    return ns;

  // Convert state into Workq.
  StateToWorkq(state, q0_);

  // Flags marking the kinds of empty-width things (^ $ etc)
  // around this byte.  Before the byte we have the flags recorded
  // in the State structure itself.  After the byte we have
  // nothing yet (but that will change: read on).
  uint32_t needflag = state->flag_ >> kFlagNeedShift;
  uint32_t beforeflag = state->flag_ & kFlagEmptyMask;
  uint32_t oldbeforeflag = beforeflag;
  uint32_t afterflag = 0;

  if (c == '\n') {
    // Insert implicit $ and ^ around \n
    beforeflag |= kEmptyEndLine;
    afterflag |= kEmptyBeginLine;
  }

  if (c == kByteEndText) {
    // Insert implicit $ and \z before the fake "end text" byte.
    beforeflag |= kEmptyEndLine | kEmptyEndText;
  }

  // The state flag kFlagLastWord says whether the last
  // byte processed was a word character.  Use that info to
  // insert empty-width (non-)word boundaries.
  bool islastword = (state->flag_ & kFlagLastWord) != 0;
  bool isword = c != kByteEndText && Prog::IsWordChar(static_cast<uint8_t>(c));
  if (isword == islastword)
    beforeflag |= kEmptyNonWordBoundary;
  else
    beforeflag |= kEmptyWordBoundary;

  // Okay, finally ready to run.
  // Only useful to rerun on empty string if there are new, useful flags.
  if (beforeflag & ~oldbeforeflag & needflag) {
    RunWorkqOnEmptyString(q0_, q1_, beforeflag);
    using std::swap;
    swap(q0_, q1_);
  }
  bool ismatch = false;
  RunWorkqOnByte(q0_, q1_, c, afterflag, &ismatch);
  using std::swap;
  swap(q0_, q1_);

  // Save afterflag along with ismatch and isword in new state.
  uint32_t flag = afterflag;
  if (ismatch)
    flag |= kFlagMatch;
  if (isword)
    flag |= kFlagLastWord;

  if (ismatch && kind_ == Prog::kManyMatch)
    ns = WorkqToCachedState(q0_, q1_, flag);
  else
    ns = WorkqToCachedState(q0_, NULL, flag);

  // Flush ns before linking to it.
  // Write barrier before updating state->next_ so that the
  // main search loop can proceed without any locking, for speed.
  // (Otherwise it would need one mutex operation per input byte.)
  state->next_[ByteMap(c)].store(ns, std::memory_order_release);
  return ns;
}